

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

_Bool imap_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  ulong uVar1;
  imapstate iVar2;
  Curl_easy *data;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  size_t __n;
  char *pcVar7;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  pcVar7 = (conn->proto).imapc.resptag;
  __n = strlen(pcVar7);
  uVar1 = __n + 1;
  if (((uVar1 <= len) && (iVar5 = bcmp(pcVar7,line,__n), iVar5 == 0)) && (line[__n] == ' ')) {
    if (len - uVar1 < 2) {
LAB_00130f99:
      iVar5 = 2;
    }
    else if (*(short *)(line + uVar1) == 0x4b4f) {
      iVar5 = 1;
    }
    else {
      if ((len - uVar1 < 7) || (iVar5 = bcmp(line + uVar1,"PREAUTH",7), iVar5 != 0))
      goto LAB_00130f99;
      iVar5 = 3;
    }
    goto switchD_00130ff9_caseD_8;
  }
  if ((len < 2) || (*(short *)line != 0x202a)) {
    if ((pvVar3 != (void *)0x0) && (*(long *)((long)pvVar3 + 0x40) == 0)) {
      if (len == 3) {
        if (*line != '+') goto LAB_0013100d;
LAB_00131015:
        iVar2 = (conn->proto).imapc.state;
        iVar5 = 0x2b;
        if ((iVar2 != IMAP_AUTHENTICATE) && (iVar2 != IMAP_APPEND)) {
          Curl_failf(data,"Unexpected continuation response");
          iVar5 = -1;
        }
        goto switchD_00130ff9_caseD_8;
      }
      if (1 < len) {
LAB_0013100d:
        if (*(short *)line == 0x202b) goto LAB_00131015;
      }
    }
    goto LAB_00130fbe;
  }
  _Var4 = false;
  iVar5 = 0x2a;
  switch((conn->proto).imapc.state) {
  case IMAP_CAPABILITY:
    pcVar7 = "CAPABILITY";
    break;
  default:
    goto switchD_00130ff9_caseD_3;
  case IMAP_LIST:
    pcVar7 = *(char **)((long)pvVar3 + 0x40);
    if (pcVar7 == (char *)0x0) {
      _Var4 = imap_matchresp(line,len,"LIST");
      if (!_Var4) goto LAB_00130fbe;
      pcVar7 = *(char **)((long)pvVar3 + 0x40);
      if (pcVar7 == (char *)0x0) goto switchD_00130ff9_caseD_8;
    }
    _Var4 = imap_matchresp(line,len,pcVar7);
    if ((((!_Var4) &&
         ((((iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"STORE"), iVar6 == 0 ||
            (_Var4 = imap_matchresp(line,len,"FETCH"), !_Var4)) &&
           (iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"SELECT"), iVar6 == 0)) &&
          ((iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"EXAMINE"), iVar6 == 0 &&
           (iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"SEARCH"), iVar6 == 0))))))
        && (iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"EXPUNGE"), iVar6 == 0)) &&
       (((iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"LSUB"), iVar6 == 0 &&
         (iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"UID"), iVar6 == 0)) &&
        (iVar6 = Curl_strcasecompare(*(char **)((long)pvVar3 + 0x40),"NOOP"), iVar6 == 0))))
    goto LAB_00130fbe;
  case IMAP_SELECT:
    goto switchD_00130ff9_caseD_8;
  case IMAP_FETCH:
    pcVar7 = "FETCH";
    break;
  case IMAP_SEARCH:
    pcVar7 = "SEARCH";
  }
  _Var4 = imap_matchresp(line,len,pcVar7);
  if (_Var4) {
switchD_00130ff9_caseD_8:
    *resp = iVar5;
    _Var4 = true;
  }
  else {
LAB_00130fbe:
    _Var4 = false;
  }
switchD_00130ff9_caseD_3:
  return _Var4;
}

Assistant:

static bool imap_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = IMAP_RESP_OK;
    else if(len >= 7 && !memcmp(line, "PREAUTH", 7))
      *resp = IMAP_RESP_PREAUTH;
    else
      *resp = IMAP_RESP_NOT_OK;

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (!strcasecompare(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           !strcasecompare(imap->custom, "SELECT") &&
           !strcasecompare(imap->custom, "EXAMINE") &&
           !strcasecompare(imap->custom, "SEARCH") &&
           !strcasecompare(imap->custom, "EXPUNGE") &&
           !strcasecompare(imap->custom, "LSUB") &&
           !strcasecompare(imap->custom, "UID") &&
           !strcasecompare(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some e-mail servers ignore this and only send a single + instead. */
  if(imap && !imap->custom && ((len == 3 && line[0] == '+') ||
     (len >= 2 && !memcmp("+ ", line, 2)))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(conn->data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}